

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_cast.cpp
# Opt level: O3

bool duckdb::StructToVarcharCast
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  VectorType VVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  char (*__src) [4];
  bool bVar4;
  byte bVar5;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  void *pvVar6;
  void *pvVar7;
  Vector *vector;
  reference pvVar8;
  pointer pVVar9;
  type pVVar10;
  type pVVar11;
  const_reference pvVar12;
  long lVar13;
  long lVar14;
  idx_t iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *extraout_RDX;
  char *pcVar19;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *len;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *extraout_RDX_00;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *extraout_RDX_01;
  ulong idx;
  Vector *pVVar20;
  size_type sVar21;
  code *pcVar22;
  anon_struct_16_3_d7536bce_for_pointer aVar23;
  Vector varchar_struct;
  anon_union_16_2_67f50693_for_value local_100;
  ulong local_f0;
  idx_t local_e8;
  undefined4 local_e0;
  undefined4 local_dc;
  data_ptr_t local_d8;
  child_list_t<LogicalType> *local_d0;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *local_c8;
  char *local_c0;
  ulong local_b8;
  LogicalType local_b0;
  Vector local_98;
  
  VVar1 = source->vector_type;
  optional_ptr<duckdb::BoundCastData,_true>::CheckValid(&parameters->cast_data);
  LogicalType::LogicalType(&local_b0,(LogicalType *)((parameters->cast_data).ptr + 4));
  Vector::Vector(&local_98,&local_b0,count);
  LogicalType::~LogicalType(&local_b0);
  StructToStructCast(source,&local_98,count,parameters);
  local_c8 = StructVector::GetEntries(source);
  Vector::Flatten(&local_98,count);
  bVar4 = StructType::IsUnnamed(&source->type);
  local_d0 = StructType::GetChildTypes_abi_cxx11_(&source->type);
  this = StructVector::GetEntries(&local_98);
  FlatVector::VerifyFlatVector(&local_98);
  local_d8 = result->data;
  pvVar6 = operator_new__((long)(this->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3);
  pvVar7 = operator_new__((long)(this->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3);
  if (count != 0) {
    local_dc = 0x7b;
    if (bVar4) {
      local_dc = 0x28;
    }
    local_e0 = 0x7d;
    if (bVar4) {
      local_e0 = 0x29;
    }
    idx = 0;
    len = extraout_RDX;
    local_e8 = count;
    do {
      if ((local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[idx >> 6] >>
           (idx & 0x3f) & 1) != 0)) {
        if ((this->
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (this->
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          vector = (Vector *)0x2;
        }
        else {
          local_f0 = idx >> 6;
          vector = (Vector *)0x2;
          sVar21 = 0;
          do {
            pVVar20 = (Vector *)&vector->field_0x2;
            if (sVar21 == 0) {
              pVVar20 = vector;
            }
            pvVar8 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                     ::operator[](local_c8,sVar21);
            pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                     operator->(pvVar8);
            bVar5 = (pVVar9->type).physical_type_ - LIST;
            pcVar22 = VectorCastHelpers::CalculateEscapedStringLength<false>;
            if (bVar5 < 7) {
              pcVar22 = (code *)(&PTR_CalculateStringLength_024519d0)[bVar5];
            }
            pvVar8 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                     ::operator[](this,sVar21);
            pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                     operator->(pvVar8);
            Vector::Flatten(pVVar9,local_e8);
            pvVar8 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                     ::operator[](this,sVar21);
            pVVar10 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar8);
            FlatVector::VerifyFlatVector(pVVar10);
            pvVar8 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                     ::operator[](this,sVar21);
            pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar8);
            pdVar2 = pVVar11->data;
            pvVar12 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                      ::operator[](local_d0,sVar21);
            if (!bVar4) {
              pcVar19 = (pvVar12->first)._M_dataplus._M_p;
              uVar17 = (pvVar12->first)._M_string_length;
              local_100.pointer.length = (uint32_t)uVar17;
              if (local_100.pointer.length < 0xd) {
                local_100._12_4_ = 0;
                local_100.pointer.prefix[0] = '\0';
                local_100.pointer.prefix[1] = '\0';
                local_100.pointer.prefix[2] = '\0';
                local_100.pointer.prefix[3] = '\0';
                local_100._8_4_ = 0;
                if (local_100.pointer.length != 0) {
                  switchD_015de399::default
                            (local_100.pointer.prefix,pcVar19,
                             (ulong)(local_100.pointer.length & 0xf));
                  pcVar19 = local_100.pointer.prefix;
                  goto LAB_012c37bc;
                }
                *(undefined1 *)((long)pvVar6 + sVar21) = 1;
                lVar13 = 2;
              }
              else {
                local_100.pointer.prefix = *(char (*) [4])pcVar19;
                local_100._8_4_ = SUB84(pcVar19,0);
                local_100._12_4_ = (undefined4)((ulong)pcVar19 >> 0x20);
LAB_012c37bc:
                *(undefined1 *)((long)pvVar6 + sVar21) = 1;
                uVar18 = 0;
                lVar14 = 0;
                do {
                  lVar13 = lVar14 + (ulong)(pcVar19[uVar18] == '\\' || pcVar19[uVar18] == '\'');
                  lVar14 = lVar13 + 1;
                  uVar18 = uVar18 + 1;
                } while ((uVar17 & 0xffffffff) != uVar18);
                lVar13 = lVar13 + 3;
              }
              pVVar20 = (Vector *)(&pVVar20->field_0x2 + lVar13);
            }
            puVar3 = (pVVar10->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if ((puVar3 == (unsigned_long *)0x0) ||
               ((puVar3[local_f0] & 1L << ((byte)idx & 0x3f)) != 0)) {
              lVar14 = (*pcVar22)(pdVar2 + idx * 0x10,(long)pvVar7 + sVar21);
            }
            else {
              lVar14 = 4;
            }
            vector = (Vector *)(&pVVar20->vector_type + lVar14);
            sVar21 = sVar21 + 1;
            len = this;
          } while (sVar21 < (ulong)((long)(this->
                                          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                          ).
                                          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->
                                          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                          ).
                                          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        aVar23 = (anon_struct_16_3_d7536bce_for_pointer)
                 StringVector::EmptyString((StringVector *)result,vector,(idx_t)len);
        lVar14 = idx * 0x10;
        local_c0 = (((anon_union_16_2_67f50693_for_value *)(local_d8 + lVar14))->pointer).prefix;
        ((anon_union_16_2_67f50693_for_value *)(local_d8 + lVar14))->pointer = aVar23;
        pcVar19 = aVar23.ptr;
        if (aVar23.length < 0xd) {
          pcVar19 = local_c0;
        }
        *pcVar19 = (char)local_dc;
        if ((this->
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (this->
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar13 = 1;
        }
        else {
          local_f0 = idx >> 6;
          lVar13 = 1;
          local_b8 = 1L << ((byte)idx & 0x3f);
          sVar21 = 0;
          do {
            if (sVar21 != 0) {
              (pcVar19 + lVar13)[0] = ',';
              (pcVar19 + lVar13)[1] = ' ';
              lVar13 = lVar13 + 2;
            }
            pvVar8 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                     ::operator[](local_c8,sVar21);
            pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                     operator->(pvVar8);
            bVar5 = (pVVar9->type).physical_type_ - LIST;
            pcVar22 = VectorCastHelpers::WriteEscapedString<false>;
            if (bVar5 < 7) {
              pcVar22 = (code *)(&PTR_WriteString_02451a08)[bVar5];
            }
            pvVar8 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                     ::operator[](this,sVar21);
            pVVar10 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar8);
            FlatVector::VerifyFlatVector(pVVar10);
            pvVar8 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                     ::operator[](this,sVar21);
            pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar8);
            pdVar2 = pVVar11->data;
            if (!bVar4) {
              pvVar12 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                        ::operator[](local_d0,sVar21);
              __src = (char (*) [4])(pvVar12->first)._M_dataplus._M_p;
              local_100.pointer.length = (uint32_t)(pvVar12->first)._M_string_length;
              if (local_100.pointer.length < 0xd) {
                local_100._12_4_ = 0;
                local_100.pointer.prefix[0] = '\0';
                local_100.pointer.prefix[1] = '\0';
                local_100.pointer.prefix[2] = '\0';
                local_100.pointer.prefix[3] = '\0';
                local_100._8_4_ = 0;
                if (local_100.pointer.length != 0) {
                  switchD_015de399::default
                            (local_100.pointer.prefix,__src,(ulong)(local_100.pointer.length & 0xf))
                  ;
                }
              }
              else {
                local_100.pointer.prefix = *__src;
                local_100._8_4_ = SUB84(__src,0);
                local_100._12_4_ = (undefined4)((ulong)__src >> 0x20);
              }
              iVar15 = VectorCastHelpers::WriteEscapedString<true>
                                 (pcVar19 + lVar13,(string_t *)&local_100.pointer,
                                  *(bool *)((long)pvVar6 + sVar21));
              (pcVar19 + iVar15 + lVar13)[0] = ':';
              (pcVar19 + iVar15 + lVar13)[1] = ' ';
              lVar13 = lVar13 + iVar15 + 2;
            }
            puVar3 = (pVVar10->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if ((puVar3 == (unsigned_long *)0x0) || ((puVar3[local_f0] & local_b8) != 0)) {
              lVar16 = (*pcVar22)(pcVar19 + lVar13,pdVar2 + lVar14,
                                  *(undefined1 *)((long)pvVar7 + sVar21));
            }
            else {
              builtin_strncpy(pcVar19 + lVar13,"NULL",4);
              lVar16 = 4;
            }
            lVar13 = lVar16 + lVar13;
            sVar21 = sVar21 + 1;
          } while (sVar21 < (ulong)((long)(this->
                                          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                          ).
                                          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->
                                          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                          ).
                                          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        len = (vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
               *)(local_d8 + lVar14);
        pcVar19[lVar13] = (char)local_e0;
        uVar17 = (ulong)*(uint *)&(len->
                                  super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                  ).
                                  super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
        if (uVar17 < 0xd) {
          switchD_01043a80::default(local_c0 + uVar17,0,0xc - uVar17);
          len = extraout_RDX_00;
          count = local_e8;
        }
        else {
          *(undefined4 *)
           ((long)&(len->
                   super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 4) =
               *(undefined4 *)
                &(((len->
                   super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->
                 super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)._M_t.
                 super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
                 super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
                 super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
          count = local_e8;
        }
      }
      else {
        FlatVector::SetNull(result,idx,true);
        len = extraout_RDX_01;
      }
      idx = idx + 1;
    } while (idx != count);
  }
  if (VVar1 == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  operator_delete__(pvVar7);
  operator_delete__(pvVar6);
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_98.type);
  return true;
}

Assistant:

static bool StructToVarcharCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto constant = source.GetVectorType() == VectorType::CONSTANT_VECTOR;
	// first cast all child elements to varchar
	auto &cast_data = parameters.cast_data->Cast<StructBoundCastData>();
	Vector varchar_struct(cast_data.target, count);
	StructToStructCast(source, varchar_struct, count, parameters);
	auto &base_children = StructVector::GetEntries(source);

	// now construct the actual varchar vector
	varchar_struct.Flatten(count);
	bool is_unnamed = StructType::IsUnnamed(source.GetType());
	auto &child_types = StructType::GetChildTypes(source.GetType());
	auto &children = StructVector::GetEntries(varchar_struct);
	auto &validity = FlatVector::Validity(varchar_struct);
	auto result_data = FlatVector::GetData<string_t>(result);
	static constexpr const idx_t SEP_LENGTH = 2;
	static constexpr const idx_t NAME_SEP_LENGTH = 2;
	static constexpr const idx_t NULL_LENGTH = 4;
	auto key_needs_quotes = make_unsafe_uniq_array_uninitialized<bool>(children.size());
	auto value_needs_quotes = make_unsafe_uniq_array_uninitialized<bool>(children.size());

	for (idx_t i = 0; i < count; i++) {
		if (!validity.RowIsValid(i)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		//! Calculate the total length of the row
		idx_t string_length = 2; // {}
		for (idx_t c = 0; c < children.size(); c++) {
			if (c > 0) {
				string_length += SEP_LENGTH;
			}
			auto add_escapes = !base_children[c]->GetType().IsNested();
			auto string_length_func = add_escapes ? VectorCastHelpers::CalculateEscapedStringLength<false>
			                                      : VectorCastHelpers::CalculateStringLength;

			children[c]->Flatten(count);
			auto &child_validity = FlatVector::Validity(*children[c]);
			auto data = FlatVector::GetData<string_t>(*children[c]);
			auto &name = child_types[c].first;
			if (!is_unnamed) {
				string_length += VectorCastHelpers::CalculateEscapedStringLength<true>(name, key_needs_quotes[c]);
				string_length += NAME_SEP_LENGTH; // ": "
			}
			if (child_validity.RowIsValid(i)) {
				//! Skip the `\`, not a special character outside quotes
				string_length += string_length_func(data[i], value_needs_quotes[c]);
			} else {
				string_length += NULL_LENGTH;
			}
		}

		result_data[i] = StringVector::EmptyString(result, string_length);
		auto dataptr = result_data[i].GetDataWriteable();

		//! Serialize the struct to the string
		idx_t offset = 0;
		dataptr[offset++] = is_unnamed ? '(' : '{';
		for (idx_t c = 0; c < children.size(); c++) {
			if (c > 0) {
				memcpy(dataptr + offset, ", ", SEP_LENGTH);
				offset += SEP_LENGTH;
			}
			auto add_escapes = !base_children[c]->GetType().IsNested();
			auto write_string_func =
			    add_escapes ? VectorCastHelpers::WriteEscapedString<false> : VectorCastHelpers::WriteString;

			auto &child_validity = FlatVector::Validity(*children[c]);
			auto data = FlatVector::GetData<string_t>(*children[c]);
			if (!is_unnamed) {
				auto &name = child_types[c].first;
				// "{<name>: <value>}"
				offset += VectorCastHelpers::WriteEscapedString<true>(dataptr + offset, name, key_needs_quotes[c]);
				dataptr[offset++] = ':';
				dataptr[offset++] = ' ';
			}
			// value
			if (child_validity.RowIsValid(i)) {
				//! Skip the `\`, not a special character outside quotes
				offset += write_string_func(dataptr + offset, data[i], value_needs_quotes[c]);
			} else {
				memcpy(dataptr + offset, "NULL", NULL_LENGTH);
				offset += NULL_LENGTH;
			}
		}
		dataptr[offset++] = is_unnamed ? ')' : '}';
		result_data[i].Finalize();
	}

	if (constant) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
	return true;
}